

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::generate(JsonSchemaGenerator *this)

{
  EnumVal *pEVar1;
  value_type pFVar2;
  FieldDef *pFVar3;
  StructDef *pSVar4;
  bool bVar5;
  reference ppEVar6;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar7;
  reference ppEVar8;
  const_reference ppEVar9;
  const_reference ppFVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  back_insert_iterator<std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  bVar13;
  reference ppFVar14;
  reference ppFVar15;
  reference ppSVar16;
  const_reference ppSVar17;
  Type *type;
  string local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  string local_1178;
  string local_1158;
  string local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  string local_1098;
  string local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  string local_1018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff8;
  string local_fd8;
  undefined1 local_fb8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> closeType;
  string local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  string local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_e98;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_e90;
  const_iterator req_prop;
  undefined1 local_e68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required_string;
  undefined1 local_e20 [8];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> requiredProperties;
  string local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  string local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  string local_d48;
  string local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  string local_cc8;
  string local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  undefined1 local_c08 [8];
  string description;
  string local_bc8;
  string local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  string local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  undefined1 local_ae8 [8];
  string typeLine;
  string local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  allocator<char> local_a21;
  string local_a20 [8];
  string deprecated_info;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  allocator<char> local_819;
  string local_818 [8];
  string arrayInfo;
  FieldDef **property;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_7e8;
  const_iterator prop;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *properties;
  string local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  string local_758;
  string local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  undefined1 local_698 [8];
  string comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *comment_lines;
  allocator<char> local_649;
  string local_648;
  string local_628;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588;
  string local_568;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  reference local_4a8;
  StructDef **structure;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_498;
  const_iterator s;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_390;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_388;
  const_iterator enum_value;
  undefined1 local_360 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enumdef;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_178;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_170;
  const_iterator e;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  JsonSchemaGenerator *local_18;
  JsonSchemaGenerator *this_local;
  
  local_18 = this;
  std::__cxx11::string::operator=((string *)&this->code_,"");
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == (StructDef *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "Error: Binary schema not generated, no root struct found\n");
    this_local._7_1_ = false;
  }
  else {
    NewLine_abi_cxx11_(&local_58,this);
    std::operator+(&local_38,"{",&local_58);
    std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    Indent_abi_cxx11_(&local_c8,this,1);
    std::operator+(&local_a8,&local_c8,
                   "\"$schema\": \"https://json-schema.org/draft/2019-09/schema\",");
    NewLine_abi_cxx11_(&local_e8,this);
    std::operator+(&local_88,&local_a8,&local_e8);
    std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    Indent_abi_cxx11_(&local_148,this,1);
    std::operator+(&local_128,&local_148,"\"definitions\": {");
    NewLine_abi_cxx11_((string *)&e,this);
    std::operator+(&local_108,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    local_170._M_current =
         (EnumDef **)
         std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::cbegin
                   (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    while( true ) {
      local_178._M_current =
           (EnumDef **)
           std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::cend
                     (&(((this->super_BaseGenerator).parser_)->enums_).vec);
      bVar5 = __gnu_cxx::operator!=(&local_170,&local_178);
      if (!bVar5) break;
      Indent_abi_cxx11_(&local_218,this,2);
      std::operator+(&local_1f8,&local_218,"\"");
      ppEVar6 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                ::operator*(&local_170);
      anon_unknown_1::GenFullName<flatbuffers::EnumDef>(&local_238,*ppEVar6);
      std::operator+(&local_1d8,&local_1f8,&local_238);
      std::operator+(&local_1b8,&local_1d8,"\" : {");
      NewLine_abi_cxx11_(&local_258,this);
      std::operator+(&local_198,&local_1b8,&local_258);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      Indent_abi_cxx11_(&local_2d8,this,3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"string",&local_319);
      anon_unknown_1::GenType(&local_2f8,&local_318);
      std::operator+(&local_2b8,&local_2d8,&local_2f8);
      std::operator+(&local_298,&local_2b8,",");
      NewLine_abi_cxx11_((string *)((long)&enumdef.field_2 + 8),this);
      std::operator+(&local_278,&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&enumdef.field_2 + 8));
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)(enumdef.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator(&local_319);
      std::__cxx11::string::~string((string *)&local_2d8);
      Indent_abi_cxx11_((string *)&enum_value,this,3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     (string *)&enum_value,"\"enum\": [");
      std::__cxx11::string::~string((string *)&enum_value);
      ppEVar6 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                ::operator*(&local_170);
      pvVar7 = EnumDef::Vals(*ppEVar6);
      local_388._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar7);
      while( true ) {
        ppEVar6 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                  ::operator*(&local_170);
        pvVar7 = EnumDef::Vals(*ppEVar6);
        local_390._M_current =
             (EnumVal **)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar7);
        bVar5 = __gnu_cxx::operator!=(&local_388,&local_390);
        if (!bVar5) break;
        ppEVar8 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_388);
        std::operator+(&local_3d0,"\"",&(*ppEVar8)->name);
        std::operator+(&local_3b0,&local_3d0,"\"");
        std::__cxx11::string::append((string *)local_360);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        ppEVar8 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_388);
        pEVar1 = *ppEVar8;
        ppEVar6 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                  ::operator*(&local_170);
        pvVar7 = EnumDef::Vals(*ppEVar6);
        ppEVar9 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::back
                            (pvVar7);
        if (pEVar1 != *ppEVar9) {
          std::__cxx11::string::append(local_360);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_388);
      }
      std::__cxx11::string::append(local_360);
      NewLine_abi_cxx11_(&local_410,this);
      std::operator+(&local_3f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     &local_410);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      Indent_abi_cxx11_(&local_470,this,2);
      std::operator+(&local_450,&local_470,"},");
      NewLine_abi_cxx11_((string *)&s,this);
      std::operator+(&local_430,&local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)local_360);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
      ::operator++(&local_170);
    }
    local_498._M_current =
         (StructDef **)
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::cbegin
                   (&(((this->super_BaseGenerator).parser_)->structs_).vec);
    while( true ) {
      structure = (StructDef **)
                  std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                  cend(&(((this->super_BaseGenerator).parser_)->structs_).vec);
      bVar5 = __gnu_cxx::operator!=
                        (&local_498,
                         (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                          *)&structure);
      if (!bVar5) break;
      local_4a8 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&local_498);
      Indent_abi_cxx11_(&local_548,this,2);
      std::operator+(&local_528,&local_548,"\"");
      anon_unknown_1::GenFullName<flatbuffers::StructDef>(&local_568,*local_4a8);
      std::operator+(&local_508,&local_528,&local_568);
      std::operator+(&local_4e8,&local_508,"\" : {");
      NewLine_abi_cxx11_(&local_588,this);
      std::operator+(&local_4c8,&local_4e8,&local_588);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      Indent_abi_cxx11_(&local_608,this,3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"object",&local_649);
      anon_unknown_1::GenType(&local_628,&local_648);
      std::operator+(&local_5e8,&local_608,&local_628);
      std::operator+(&local_5c8,&local_5e8,",");
      NewLine_abi_cxx11_((string *)&comment_lines,this);
      std::operator+(&local_5a8,&local_5c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &comment_lines);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&comment_lines);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator(&local_649);
      std::__cxx11::string::~string((string *)&local_608);
      comment.field_2._8_8_ = &((*local_4a8)->super_Definition).doc_comment;
      PrepareDescription((string *)local_698,this,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)comment.field_2._8_8_);
      bVar5 = std::operator!=((string *)local_698,"");
      if (bVar5) {
        Indent_abi_cxx11_(&local_738,this,3);
        std::operator+(&local_718,&local_738,"\"description\" : ");
        std::operator+(&local_6f8,&local_718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_698);
        std::operator+(&local_6d8,&local_6f8,",");
        NewLine_abi_cxx11_(&local_758,this);
        std::operator+(&local_6b8,&local_6d8,&local_758);
        std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_738);
      }
      Indent_abi_cxx11_(&local_7b8,this,3);
      std::operator+(&local_798,&local_7b8,"\"properties\" : {");
      NewLine_abi_cxx11_((string *)&properties,this);
      std::operator+(&local_778,&local_798,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &properties);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_778);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&properties);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_7b8);
      prop._M_current = (FieldDef **)&((*local_4a8)->fields).vec;
      local_7e8._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::cbegin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      prop._M_current);
      while( true ) {
        property = (FieldDef **)
                   std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                   cend(prop._M_current);
        bVar5 = __gnu_cxx::operator!=
                          (&local_7e8,
                           (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&property);
        if (!bVar5) break;
        arrayInfo.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
             ::operator*(&local_7e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_818,"",&local_819);
        std::allocator<char>::~allocator(&local_819);
        bVar5 = IsArray((Type *)(*(long *)arrayInfo.field_2._8_8_ + 200));
        if (bVar5) {
          NewLine_abi_cxx11_(&local_960,this);
          std::operator+(&local_940,",",&local_960);
          Indent_abi_cxx11_(&local_980,this,8);
          std::operator+(&local_920,&local_940,&local_980);
          std::operator+(&local_900,&local_920,"\"minItems\": ");
          NumToString<unsigned_short>
                    (&local_9a0,*(unsigned_short *)(*(long *)arrayInfo.field_2._8_8_ + 0xe0));
          std::operator+(&local_8e0,&local_900,&local_9a0);
          std::operator+(&local_8c0,&local_8e0,",");
          NewLine_abi_cxx11_(&local_9c0,this);
          std::operator+(&local_8a0,&local_8c0,&local_9c0);
          Indent_abi_cxx11_(&local_9e0,this,8);
          std::operator+(&local_880,&local_8a0,&local_9e0);
          std::operator+(&local_860,&local_880,"\"maxItems\": ");
          NumToString<unsigned_short>
                    ((string *)((long)&deprecated_info.field_2 + 8),
                     *(unsigned_short *)(*(long *)arrayInfo.field_2._8_8_ + 0xe0));
          std::operator+(&local_840,&local_860,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&deprecated_info.field_2 + 8));
          std::__cxx11::string::operator=(local_818,(string *)&local_840);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)(deprecated_info.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_860);
          std::__cxx11::string::~string((string *)&local_880);
          std::__cxx11::string::~string((string *)&local_9e0);
          std::__cxx11::string::~string((string *)&local_8a0);
          std::__cxx11::string::~string((string *)&local_9c0);
          std::__cxx11::string::~string((string *)&local_8c0);
          std::__cxx11::string::~string((string *)&local_8e0);
          std::__cxx11::string::~string((string *)&local_9a0);
          std::__cxx11::string::~string((string *)&local_900);
          std::__cxx11::string::~string((string *)&local_920);
          std::__cxx11::string::~string((string *)&local_980);
          std::__cxx11::string::~string((string *)&local_940);
          std::__cxx11::string::~string((string *)&local_960);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_a20,"",&local_a21);
        std::allocator<char>::~allocator(&local_a21);
        if ((*(byte *)(*(long *)arrayInfo.field_2._8_8_ + 0x110) & 1) != 0) {
          NewLine_abi_cxx11_(&local_aa8,this);
          std::operator+(&local_a88,",",&local_aa8);
          Indent_abi_cxx11_((string *)((long)&typeLine.field_2 + 8),this,8);
          std::operator+(&local_a68,&local_a88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&typeLine.field_2 + 8));
          std::operator+(&local_a48,&local_a68,"\"deprecated\" : true");
          std::__cxx11::string::operator=(local_a20,(string *)&local_a48);
          std::__cxx11::string::~string((string *)&local_a48);
          std::__cxx11::string::~string((string *)&local_a68);
          std::__cxx11::string::~string((string *)(typeLine.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_a88);
          std::__cxx11::string::~string((string *)&local_aa8);
        }
        Indent_abi_cxx11_(&local_b48,this,4);
        std::operator+(&local_b28,&local_b48,"\"");
        std::operator+(&local_b08,&local_b28,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        arrayInfo.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ae8,&local_b08,"\"");
        std::__cxx11::string::~string((string *)&local_b08);
        std::__cxx11::string::~string((string *)&local_b28);
        std::__cxx11::string::~string((string *)&local_b48);
        NewLine_abi_cxx11_(&local_ba8,this);
        std::operator+(&local_b88," : {",&local_ba8);
        Indent_abi_cxx11_(&local_bc8,this,8);
        std::operator+(&local_b68,&local_b88,&local_bc8);
        std::__cxx11::string::operator+=((string *)local_ae8,(string *)&local_b68);
        std::__cxx11::string::~string((string *)&local_b68);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::__cxx11::string::~string((string *)&local_b88);
        std::__cxx11::string::~string((string *)&local_ba8);
        (anonymous_namespace)::GenType_abi_cxx11_
                  ((string *)((long)&description.field_2 + 8),
                   (_anonymous_namespace_ *)(*(long *)arrayInfo.field_2._8_8_ + 200),type);
        std::__cxx11::string::operator+=
                  ((string *)local_ae8,(string *)(description.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_ae8,local_818);
        std::__cxx11::string::operator+=((string *)local_ae8,local_a20);
        PrepareDescription((string *)local_c08,this,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(*(long *)arrayInfo.field_2._8_8_ + 0x40));
        bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c08,"");
        if (bVar5) {
          NewLine_abi_cxx11_(&local_ca8,this);
          std::operator+(&local_c88,",",&local_ca8);
          Indent_abi_cxx11_(&local_cc8,this,8);
          std::operator+(&local_c68,&local_c88,&local_cc8);
          std::operator+(&local_c48,&local_c68,"\"description\" : ");
          std::operator+(&local_c28,&local_c48,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c08);
          std::__cxx11::string::operator+=((string *)local_ae8,(string *)&local_c28);
          std::__cxx11::string::~string((string *)&local_c28);
          std::__cxx11::string::~string((string *)&local_c48);
          std::__cxx11::string::~string((string *)&local_c68);
          std::__cxx11::string::~string((string *)&local_cc8);
          std::__cxx11::string::~string((string *)&local_c88);
          std::__cxx11::string::~string((string *)&local_ca8);
        }
        NewLine_abi_cxx11_(&local_d28,this);
        Indent_abi_cxx11_(&local_d48,this,7);
        std::operator+(&local_d08,&local_d28,&local_d48);
        std::operator+(&local_ce8,&local_d08,"}");
        std::__cxx11::string::operator+=((string *)local_ae8,(string *)&local_ce8);
        std::__cxx11::string::~string((string *)&local_ce8);
        std::__cxx11::string::~string((string *)&local_d08);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&local_d28);
        pFVar2 = *(value_type *)arrayInfo.field_2._8_8_;
        ppFVar10 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                   back((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )prop._M_current);
        if (pFVar2 != *ppFVar10) {
          std::__cxx11::string::append(local_ae8);
        }
        NewLine_abi_cxx11_(&local_d88,this);
        std::operator+(&local_d68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ae8,&local_d88);
        std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_d68);
        std::__cxx11::string::~string((string *)&local_d68);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)local_c08);
        std::__cxx11::string::~string((string *)local_ae8);
        std::__cxx11::string::~string(local_a20);
        std::__cxx11::string::~string(local_818);
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_7e8);
      }
      Indent_abi_cxx11_(&local_de8,this,3);
      std::operator+(&local_dc8,&local_de8,"},");
      NewLine_abi_cxx11_((string *)
                         &requiredProperties.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
      std::operator+(&local_da8,&local_dc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &requiredProperties.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_da8);
      std::__cxx11::string::~string((string *)&local_da8);
      std::__cxx11::string::~string
                ((string *)
                 &requiredProperties.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::__cxx11::string::~string((string *)&local_de8);
      std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 local_e20);
      cVar11 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                         (prop._M_current);
      cVar12 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                         (prop._M_current);
      bVar13 = std::
               back_inserter<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>
                         ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           *)local_e20);
      required_string.field_2._8_8_ =
           std::
           copy_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,std::back_insert_iterator<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,flatbuffers::jsons::JsonSchemaGenerator::generate()::_lambda(flatbuffers::FieldDef_const*)_1_>
                     (cVar11._M_current,cVar12._M_current,bVar13.container);
      bVar5 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)local_e20);
      if (!bVar5) {
        Indent_abi_cxx11_((string *)&req_prop,this,3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_e68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &req_prop,"\"required\" : [");
        std::__cxx11::string::~string((string *)&req_prop);
        local_e90._M_current =
             (FieldDef **)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::cbegin
                       ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )local_e20);
        while( true ) {
          local_e98._M_current =
               (FieldDef **)
               std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::cend
                         ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           *)local_e20);
          bVar5 = __gnu_cxx::operator!=(&local_e90,&local_e98);
          if (!bVar5) break;
          ppFVar14 = __gnu_cxx::
                     __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                     ::operator*(&local_e90);
          std::operator+(&local_ed8,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *ppFVar14);
          std::operator+(&local_eb8,&local_ed8,"\"");
          std::__cxx11::string::append((string *)local_e68);
          std::__cxx11::string::~string((string *)&local_eb8);
          std::__cxx11::string::~string((string *)&local_ed8);
          ppFVar14 = __gnu_cxx::
                     __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                     ::operator*(&local_e90);
          pFVar3 = *ppFVar14;
          ppFVar15 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ::back((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                             *)local_e20);
          if (pFVar3 != *ppFVar15) {
            std::__cxx11::string::append(local_e68);
          }
          __gnu_cxx::
          __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
          ::operator++(&local_e90);
        }
        std::__cxx11::string::append(local_e68);
        NewLine_abi_cxx11_(&local_f18,this);
        std::operator+(&local_ef8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_e68,&local_f18);
        std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_ef8);
        std::__cxx11::string::~string((string *)&local_ef8);
        std::__cxx11::string::~string((string *)&local_f18);
        std::__cxx11::string::~string((string *)local_e68);
      }
      Indent_abi_cxx11_(&local_f78,this,3);
      std::operator+(&local_f58,&local_f78,"\"additionalProperties\" : false");
      NewLine_abi_cxx11_((string *)((long)&closeType.field_2 + 8),this);
      std::operator+(&local_f38,&local_f58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&closeType.field_2 + 8));
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_f38);
      std::__cxx11::string::~string((string *)&local_f38);
      std::__cxx11::string::~string((string *)(closeType.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_f58);
      std::__cxx11::string::~string((string *)&local_f78);
      Indent_abi_cxx11_(&local_fd8,this,2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fb8,
                     &local_fd8,"}");
      std::__cxx11::string::~string((string *)&local_fd8);
      ppSVar16 = __gnu_cxx::
                 __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                 ::operator*(&local_498);
      pSVar4 = *ppSVar16;
      ppSVar17 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 back(&(((this->super_BaseGenerator).parser_)->structs_).vec);
      if (pSVar4 != *ppSVar17) {
        std::__cxx11::string::append(local_fb8);
      }
      NewLine_abi_cxx11_(&local_1018,this);
      std::operator+(&local_ff8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fb8,
                     &local_1018);
      std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_ff8);
      std::__cxx11::string::~string((string *)&local_ff8);
      std::__cxx11::string::~string((string *)&local_1018);
      std::__cxx11::string::~string((string *)local_fb8);
      std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 local_e20);
      std::__cxx11::string::~string((string *)local_698);
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
      ::operator++(&local_498);
    }
    Indent_abi_cxx11_(&local_1078,this,1);
    std::operator+(&local_1058,&local_1078,"},");
    NewLine_abi_cxx11_(&local_1098,this);
    std::operator+(&local_1038,&local_1058,&local_1098);
    std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_1038);
    std::__cxx11::string::~string((string *)&local_1038);
    std::__cxx11::string::~string((string *)&local_1098);
    std::__cxx11::string::~string((string *)&local_1058);
    std::__cxx11::string::~string((string *)&local_1078);
    Indent_abi_cxx11_(&local_1138,this,1);
    std::operator+(&local_1118,&local_1138,"\"$ref\" : \"#/definitions/");
    anon_unknown_1::GenFullName<flatbuffers::StructDef>
              (&local_1158,((this->super_BaseGenerator).parser_)->root_struct_def_);
    std::operator+(&local_10f8,&local_1118,&local_1158);
    std::operator+(&local_10d8,&local_10f8,"\"");
    NewLine_abi_cxx11_(&local_1178,this);
    std::operator+(&local_10b8,&local_10d8,&local_1178);
    std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_10b8);
    std::__cxx11::string::~string((string *)&local_10b8);
    std::__cxx11::string::~string((string *)&local_1178);
    std::__cxx11::string::~string((string *)&local_10d8);
    std::__cxx11::string::~string((string *)&local_10f8);
    std::__cxx11::string::~string((string *)&local_1158);
    std::__cxx11::string::~string((string *)&local_1118);
    std::__cxx11::string::~string((string *)&local_1138);
    NewLine_abi_cxx11_(&local_11b8,this);
    std::operator+(&local_1198,"}",&local_11b8);
    std::__cxx11::string::operator+=((string *)&this->code_,(string *)&local_1198);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&local_11b8);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool generate() {
    code_ = "";
    if (parser_.root_struct_def_ == nullptr) {
      std::cerr << "Error: Binary schema not generated, no root struct found\n";
      return false;
    }
    code_ += "{" + NewLine();
    code_ += Indent(1) +
             "\"$schema\": \"https://json-schema.org/draft/2019-09/schema\"," +
             NewLine();
    code_ += Indent(1) + "\"definitions\": {" + NewLine();
    for (auto e = parser_.enums_.vec.cbegin(); e != parser_.enums_.vec.cend();
         ++e) {
      code_ += Indent(2) + "\"" + GenFullName(*e) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("string") + "," + NewLine();
      auto enumdef(Indent(3) + "\"enum\": [");
      for (auto enum_value = (*e)->Vals().begin();
           enum_value != (*e)->Vals().end(); ++enum_value) {
        enumdef.append("\"" + (*enum_value)->name + "\"");
        if (*enum_value != (*e)->Vals().back()) { enumdef.append(", "); }
      }
      enumdef.append("]");
      code_ += enumdef + NewLine();
      code_ += Indent(2) + "}," + NewLine();  // close type
    }
    for (auto s = parser_.structs_.vec.cbegin();
         s != parser_.structs_.vec.cend(); ++s) {
      const auto &structure = *s;
      code_ += Indent(2) + "\"" + GenFullName(structure) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("object") + "," + NewLine();
      const auto &comment_lines = structure->doc_comment;
      auto comment = PrepareDescription(comment_lines);
      if (comment != "") {
        code_ += Indent(3) + "\"description\" : " + comment + "," + NewLine();
      }

      code_ += Indent(3) + "\"properties\" : {" + NewLine();

      const auto &properties = structure->fields.vec;
      for (auto prop = properties.cbegin(); prop != properties.cend(); ++prop) {
        const auto &property = *prop;
        std::string arrayInfo = "";
        if (IsArray(property->value.type)) {
          arrayInfo = "," + NewLine() + Indent(8) + "\"minItems\": " +
                      NumToString(property->value.type.fixed_length) + "," +
                      NewLine() + Indent(8) + "\"maxItems\": " +
                      NumToString(property->value.type.fixed_length);
        }
        std::string deprecated_info = "";
        if (property->deprecated) {
          deprecated_info =
              "," + NewLine() + Indent(8) + "\"deprecated\" : true";
        }
        std::string typeLine = Indent(4) + "\"" + property->name + "\"";
        typeLine += " : {" + NewLine() + Indent(8);
        typeLine += GenType(property->value.type);
        typeLine += arrayInfo;
        typeLine += deprecated_info;
        auto description = PrepareDescription(property->doc_comment);
        if (description != "") {
          typeLine +=
              "," + NewLine() + Indent(8) + "\"description\" : " + description;
        }

        typeLine += NewLine() + Indent(7) + "}";
        if (property != properties.back()) { typeLine.append(","); }
        code_ += typeLine + NewLine();
      }
      code_ += Indent(3) + "}," + NewLine();  // close properties

      std::vector<FieldDef *> requiredProperties;
      std::copy_if(properties.begin(), properties.end(),
                   back_inserter(requiredProperties),
                   [](FieldDef const *prop) { return prop->IsRequired(); });
      if (!requiredProperties.empty()) {
        auto required_string(Indent(3) + "\"required\" : [");
        for (auto req_prop = requiredProperties.cbegin();
             req_prop != requiredProperties.cend(); ++req_prop) {
          required_string.append("\"" + (*req_prop)->name + "\"");
          if (*req_prop != requiredProperties.back()) {
            required_string.append(", ");
          }
        }
        required_string.append("],");
        code_ += required_string + NewLine();
      }
      code_ += Indent(3) + "\"additionalProperties\" : false" + NewLine();
      auto closeType(Indent(2) + "}");
      if (*s != parser_.structs_.vec.back()) { closeType.append(","); }
      code_ += closeType + NewLine();  // close type
    }
    code_ += Indent(1) + "}," + NewLine();  // close definitions

    // mark root type
    code_ += Indent(1) + "\"$ref\" : \"#/definitions/" +
             GenFullName(parser_.root_struct_def_) + "\"" + NewLine();

    code_ += "}" + NewLine();  // close schema root
    return true;
  }